

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumImageTexture *
pbrt::SpectrumImageTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,
          SpectrumType spectrumType,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Alloc_hider __s1;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  FilterFunction FVar6;
  bool bVar7;
  Float FVar8;
  optional<pbrt::WrapMode> wrapMode;
  bool invert;
  string filename;
  string wrapString;
  string encodingString;
  Allocator alloc_local;
  Float scale;
  MIPMapFilterOptions local_a4;
  SpectrumType spectrumType_local;
  ColorEncodingHandle encoding;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_78;
  string filter;
  TextureMapping2DHandle map;
  
  alloc_local = alloc;
  spectrumType_local = spectrumType;
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  paVar1 = &wrapString.field_2;
  wrapString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wrapString,"maxanisotropy","");
  FVar8 = TextureParameterDictionary::GetOneFloat(parameters,&wrapString,8.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != paVar1) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  wrapString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&wrapString,"filter","");
  paVar2 = &filename.field_2;
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"bilinear","");
  TextureParameterDictionary::GetOneString(&filter,parameters,&wrapString,&filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != paVar1) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  local_a4.filter = EWA;
  local_a4.maxAnisotropy = FVar8;
  iVar4 = std::__cxx11::string::compare((char *)&filter);
  bVar7 = true;
  FVar6 = EWA;
  if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&filter), iVar4 != 0)) {
    iVar4 = std::__cxx11::string::compare((char *)&filter);
    if (iVar4 == 0) {
      FVar6 = Trilinear;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&filter);
      if (iVar4 == 0) {
        FVar6 = Bilinear;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&filter);
        bVar7 = iVar4 == 0;
        FVar6 = Point;
      }
    }
  }
  if (!bVar7) {
    wrapString._M_string_length = 0;
    wrapString.field_2._M_local_buf[0] = '\0';
    wrapString._M_dataplus._M_p = (pointer)paVar1;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              (&wrapString,"%s: filter function unknown",&filter);
    Error(loc,wrapString._M_dataplus._M_p);
    FVar6 = local_a4.filter;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)wrapString._M_dataplus._M_p != paVar1) {
      operator_delete(wrapString._M_dataplus._M_p,
                      CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                               wrapString.field_2._M_local_buf[0]) + 1);
      FVar6 = local_a4.filter;
    }
  }
  local_a4.filter = FVar6;
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"wrap","");
  paVar1 = &encodingString.field_2;
  encodingString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encodingString,"repeat","");
  TextureParameterDictionary::GetOneString(&wrapString,parameters,&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != paVar1) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  __s1._M_p = wrapString._M_dataplus._M_p;
  iVar4 = strcmp(wrapString._M_dataplus._M_p,"clamp");
  if (iVar4 == 0) {
    wrapMode.optionalValue = (aligned_storage_t<sizeof(pbrt::WrapMode),_alignof(pbrt::WrapMode)>)0x0
    ;
    wrapMode.set = true;
    wrapMode.optionalValue = (aligned_storage_t<sizeof(pbrt::WrapMode),_alignof(pbrt::WrapMode)>)0x2
    ;
  }
  else {
    iVar4 = strcmp(__s1._M_p,"repeat");
    if (iVar4 == 0) {
      wrapMode.optionalValue =
           (aligned_storage_t<sizeof(pbrt::WrapMode),_alignof(pbrt::WrapMode)>)0x0;
      wrapMode.set = true;
    }
    else {
      iVar4 = strcmp(__s1._M_p,"black");
      if (iVar4 == 0) {
        wrapMode.optionalValue =
             (aligned_storage_t<sizeof(pbrt::WrapMode),_alignof(pbrt::WrapMode)>)0x0;
        wrapMode.set = true;
        wrapMode.optionalValue =
             (aligned_storage_t<sizeof(pbrt::WrapMode),_alignof(pbrt::WrapMode)>)0x1;
      }
      else {
        iVar4 = strcmp(__s1._M_p,"octahedralsphere");
        if (iVar4 == 0) {
          wrapMode.optionalValue =
               (aligned_storage_t<sizeof(pbrt::WrapMode),_alignof(pbrt::WrapMode)>)0x0;
          wrapMode.set = true;
          wrapMode.optionalValue =
               (aligned_storage_t<sizeof(pbrt::WrapMode),_alignof(pbrt::WrapMode)>)0x3;
        }
        else {
          wrapMode.optionalValue =
               (aligned_storage_t<sizeof(pbrt::WrapMode),_alignof(pbrt::WrapMode)>)0x0;
          wrapMode.set = false;
          wrapMode._5_3_ = 0;
        }
      }
    }
  }
  if (wrapMode.set == false) {
    ErrorExit<std::__cxx11::string&>("%s: wrap mode unknown",&wrapString);
  }
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"scale","");
  scale = TextureParameterDictionary::GetOneFloat(parameters,&filename,1.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  filename._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&filename,"invert","");
  invert = TextureParameterDictionary::GetOneBool(parameters,&filename,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            )&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encoding,"filename","");
  paVar3 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  TextureParameterDictionary::GetOneString(&encodingString,parameters,(string *)&encoding,&local_78)
  ;
  ResolveFilename(&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != paVar1) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits != (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                )&local_88) {
    operator_delete((void *)encoding.
                            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                            .bits,local_88._M_allocated_capacity + 1);
  }
  encodingString._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encodingString,"png","");
  bVar7 = HasExtension(&filename,&encodingString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != paVar1) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            )&local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)&encoding,"encoding","");
  pcVar5 = "linear";
  if (bVar7) {
    pcVar5 = "sRGB";
  }
  local_78._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,pcVar5,pcVar5 + (ulong)!bVar7 * 2 + 4);
  TextureParameterDictionary::GetOneString(&encodingString,parameters,(string *)&encoding,&local_78)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar3) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits != (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                )&local_88) {
    operator_delete((void *)encoding.
                            super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                            .bits,local_88._M_allocated_capacity + 1);
  }
  ColorEncodingHandle::Get((string *)&encoding,(memory_resource *)&encodingString);
  if (wrapMode.set == false) {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
  }
  iVar4 = (*(alloc_local.memoryResource)->_vptr_memory_resource[2])
                    (alloc_local.memoryResource,0x20,8);
  pstd::pmr::polymorphic_allocator<std::byte>::
  construct<pbrt::SpectrumImageTexture,pbrt::TextureMapping2DHandle&,std::__cxx11::string&,pbrt::MIPMapFilterOptions&,pbrt::WrapMode&,float&,bool&,pbrt::ColorEncodingHandle&,pbrt::SpectrumType&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (&alloc_local,(SpectrumImageTexture *)CONCAT44(extraout_var,iVar4),&map,&filename,
             &local_a4,(WrapMode *)&wrapMode,&scale,&invert,&encoding,&spectrumType_local,
             &alloc_local);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)encodingString._M_dataplus._M_p != paVar1) {
    operator_delete(encodingString._M_dataplus._M_p,encodingString.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename._M_dataplus._M_p != paVar2) {
    operator_delete(filename._M_dataplus._M_p,filename.field_2._M_allocated_capacity + 1);
  }
  if (wrapMode.set == true) {
    wrapMode.set = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)wrapString._M_dataplus._M_p != &wrapString.field_2) {
    operator_delete(wrapString._M_dataplus._M_p,
                    CONCAT71(wrapString.field_2._M_allocated_capacity._1_7_,
                             wrapString.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filter._M_dataplus._M_p != &filter.field_2) {
    operator_delete(filter._M_dataplus._M_p,filter.field_2._M_allocated_capacity + 1);
  }
  return (SpectrumImageTexture *)CONCAT44(extraout_var,iVar4);
}

Assistant:

SpectrumImageTexture *SpectrumImageTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    SpectrumType spectrumType, const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    // Initialize _ImageTexture_ parameters
    Float maxAniso = parameters.GetOneFloat("maxanisotropy", 8.f);
    std::string filter = parameters.GetOneString("filter", "bilinear");
    MIPMapFilterOptions filterOptions;
    filterOptions.maxAnisotropy = maxAniso;
    pstd::optional<FilterFunction> ff = ParseFilter(filter);
    if (ff)
        filterOptions.filter = *ff;
    else
        Error(loc, "%s: filter function unknown", filter);

    std::string wrapString = parameters.GetOneString("wrap", "repeat");
    pstd::optional<WrapMode> wrapMode = ParseWrapMode(wrapString.c_str());
    if (!wrapMode)
        ErrorExit("%s: wrap mode unknown", wrapString);
    Float scale = parameters.GetOneFloat("scale", 1.f);
    bool invert = parameters.GetOneBool("invert", false);
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));

    const char *defaultEncoding = HasExtension(filename, "png") ? "sRGB" : "linear";
    std::string encodingString = parameters.GetOneString("encoding", defaultEncoding);
    ColorEncodingHandle encoding = ColorEncodingHandle::Get(encodingString, alloc);

    return alloc.new_object<SpectrumImageTexture>(map, filename, filterOptions, *wrapMode,
                                                  scale, invert, encoding, spectrumType,
                                                  alloc);
}